

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataView.cpp
# Opt level: O1

Var Js::DataView::EntrySetInt16(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  uint32 uVar5;
  BOOL isLittleEndian;
  undefined4 *puVar6;
  Var pvVar7;
  DataView *this;
  short value;
  int in_stack_00000010;
  CallInfo local_48;
  CallInfo callInfo_local;
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_48 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != local_48._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DataView.cpp"
                                ,0x195,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00b47a31;
    *puVar6 = 0;
  }
  callInfo_local = local_48;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,&local_48);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_48 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DataView.cpp"
                                ,0x198,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00b47a31;
    *puVar6 = 0;
  }
  if ((callInfo_local._0_4_ & 0xffffff) == 1) {
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec20,L"offset");
  }
  if (((ulong)callInfo_local & 0xffffff) == 0) {
LAB_00b47a22:
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec21,(PCWSTR)0x0);
  }
  isLittleEndian = 0;
  pvVar7 = Arguments::operator[]((Arguments *)&callInfo_local,0);
  bVar3 = VarIs<Js::DataView>(pvVar7);
  if (!bVar3) goto LAB_00b47a22;
  value = 0;
  if (2 < (callInfo_local._0_4_ & 0xffffff)) {
    pvVar7 = Arguments::operator[]((Arguments *)&callInfo_local,2);
    BVar4 = JavascriptOperators::IsUndefined(pvVar7);
    isLittleEndian = 0;
    pvVar7 = (Var)0x0;
    if (BVar4 == 0) {
      pvVar7 = Arguments::operator[]((Arguments *)&callInfo_local,2);
      if (((ulong)pvVar7 & 0x1ffff00000000) != 0x1000000000000 &&
          ((ulong)pvVar7 & 0xffff000000000000) == 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar3) goto LAB_00b47a31;
        *puVar6 = 0;
      }
      if (((ulong)pvVar7 & 0xffff000000000000) == 0x1000000000000) {
        if (((ulong)pvVar7 & 0x1ffff00000000) != 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                      "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
          if (!bVar3) {
LAB_00b47a31:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar6 = 0;
        }
      }
      else {
        uVar5 = JavascriptConversion::ToUInt32_Full(pvVar7,pSVar1);
        pvVar7 = (Var)(ulong)uVar5;
      }
    }
    value = (short)pvVar7;
    if (((ulong)callInfo_local & 0xfffffc) != 0) {
      pvVar7 = Arguments::operator[]((Arguments *)&callInfo_local,3);
      isLittleEndian = JavascriptConversion::ToBoolean(pvVar7,pSVar1);
    }
  }
  pvVar7 = Arguments::operator[]((Arguments *)&callInfo_local,0);
  this = VarTo<Js::DataView>(pvVar7);
  pvVar7 = Arguments::operator[]((Arguments *)&callInfo_local,1);
  SetValue<short,short*>(this,pvVar7,value,isLittleEndian,L"DataView.prototype.SetInt16");
  return (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
         undefinedValue.ptr;
}

Assistant:

Var DataView::EntrySetInt16(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        BOOL isLittleEndian = FALSE;
        int16 value = 0;
        switch (args.Info.Count)
        {
        case 0:
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedDataView);
            break;
        case 1:
            JavascriptError::ThrowTypeError(scriptContext, JSERR_DataView_NeedArgument, _u("offset"));
            break;
        default:
            if (!VarIs<DataView>(args[0]))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedDataView);
                break;
            }
            if (args.Info.Count > 2)
            {
                if (!JavascriptOperators::IsUndefined(args[2]))
                {
                    value = JavascriptConversion::ToInt16(args[2], scriptContext);
                }
                if (args.Info.Count > 3)
                {
                    isLittleEndian = JavascriptConversion::ToBoolean(args[3], scriptContext);
                }
            }
            break;
        }

        DataView* dataView = VarTo<DataView>(args[0]);
        dataView->SetValue<int16>(args[1], value, _u("DataView.prototype.SetInt16"), isLittleEndian);
        return scriptContext->GetLibrary()->GetUndefined();
    }